

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x2x.cc
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_21a7::DataTransform<signed_char,_float>::Run
          (DataTransform<signed_char,_float> *this,istream *input_stream)

{
  float fVar1;
  NumericType NVar2;
  WarningType WVar3;
  bool bVar4;
  char *__nptr;
  bool bVar5;
  int *piVar6;
  undefined8 uVar7;
  ulong uVar8;
  ostream *poVar9;
  size_t sVar10;
  int iVar11;
  ushort in_FPUControlWord;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  longdouble in_ST7;
  float fVar12;
  char input_data;
  string word;
  char buffer [128];
  char local_27d [3];
  ushort local_27a;
  short local_278;
  short local_276;
  int local_274;
  float local_270;
  float local_26c;
  undefined1 local_268 [16];
  string *local_258;
  string local_250;
  char *local_230;
  long local_228;
  char local_220 [96];
  ios_base local_1c0 [264];
  char local_b8 [136];
  
  local_258 = &this->print_format_;
  uVar8 = 0;
  do {
    if (this->is_ascii_input_ == true) {
      local_230 = local_220;
      local_228 = 0;
      local_220[0] = '\0';
      std::operator>>(input_stream,(string *)&local_230);
      __nptr = local_230;
      local_268._0_8_ = uVar8;
      if (local_228 == 0) {
        bVar4 = true;
        bVar5 = false;
      }
      else {
        piVar6 = __errno_location();
        local_274 = *piVar6;
        *piVar6 = 0;
        strtold(__nptr,(char **)&local_250);
        if (local_250._M_dataplus._M_p == __nptr) {
          uVar7 = std::__throw_invalid_argument("stold");
LAB_00116aa8:
          if (local_230 != local_220) {
            operator_delete(local_230);
          }
          _Unwind_Resume(uVar7);
        }
        if (*piVar6 == 0) {
          *piVar6 = local_274;
        }
        else if (*piVar6 == 0x22) {
          uVar7 = std::__throw_out_of_range("stold");
          goto LAB_00116aa8;
        }
        local_27a = in_FPUControlWord | 0xc00;
        local_276 = (short)ROUND(in_ST0);
        local_27d[0] = (char)local_276;
        bVar4 = false;
        bVar5 = true;
        in_ST0 = in_ST1;
        in_ST1 = in_ST2;
        in_ST2 = in_ST3;
        in_ST3 = in_ST4;
        in_ST4 = in_ST5;
        in_ST5 = in_ST6;
        in_ST6 = in_ST7;
      }
      if (local_230 != local_220) {
        operator_delete(local_230);
      }
      iVar11 = local_268._0_4_;
      uVar8 = local_268._0_8_;
      if (bVar5) goto LAB_00116780;
      if (bVar4) {
        if (!bVar4) {
          return false;
        }
        goto LAB_00116a54;
      }
    }
    else {
      bVar5 = sptk::ReadStream<signed_char>(local_27d,input_stream);
      if (!bVar5) {
LAB_00116a54:
        if (this->is_ascii_output_ != true) {
          return true;
        }
        if ((int)((long)((ulong)(uint)((int)uVar8 >> 0x1f) << 0x20 | uVar8 & 0xffffffff) %
                 (long)this->num_column_) != 0) {
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
          std::ostream::put(-0x78);
          std::ostream::flush();
          return true;
        }
        return true;
      }
LAB_00116780:
      iVar11 = (int)uVar8;
      uVar8 = (ulong)local_27d[0];
      fVar12 = this->minimum_value_;
      fVar1 = this->maximum_value_;
      if (fVar1 <= fVar12) {
LAB_00116933:
        in_ST7 = in_ST6;
        if (this->rounding_ == true) {
          fVar12 = (float)(int)local_27d[0];
          if (local_27d[0] < '\x01') {
            fVar12 = fVar12 + -0.5;
          }
          else {
            fVar12 = fVar12 + 0.5;
          }
        }
        else {
          fVar12 = (float)(int)local_27d[0];
        }
      }
      else {
        NVar2 = this->input_numeric_type_;
        if (NVar2 == kFloatingPoint) {
          local_278 = (short)local_27d[0];
          in_ST6 = in_ST5;
          local_26c = fVar12;
          if (((float)local_278 < fVar12) ||
             (fVar12 = fVar1, local_270 = fVar1, fVar1 < (float)local_278)) goto LAB_00116883;
          goto LAB_00116933;
        }
        if (NVar2 == kUnsignedInteger) {
          if (((ulong)((long)(fVar12 - 9.223372e+18) & (long)fVar12 >> 0x3f | (long)fVar12) <= uVar8
              ) && (fVar12 = fVar1,
                   uVar8 <= (ulong)((long)(fVar1 - 9.223372e+18) & (long)fVar1 >> 0x3f | (long)fVar1
                                   ))) goto LAB_00116933;
        }
        else if ((NVar2 != kSignedInteger) ||
                (((long)fVar12 <= (long)uVar8 && (fVar12 = fVar1, (long)uVar8 <= (long)fVar1))))
        goto LAB_00116933;
LAB_00116883:
        in_ST7 = in_ST6;
        if (this->warning_type_ != kIgnore) {
          local_268 = ZEXT416((uint)fVar12);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_230);
          poVar9 = (ostream *)std::ostream::operator<<((ostream *)&local_230,iVar11);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar9,"th data is over the range of output type",0x28);
          local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"x2x","");
          sptk::PrintErrorMessage(&local_250,(ostringstream *)&local_230);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_250._M_dataplus._M_p != &local_250.field_2) {
            operator_delete(local_250._M_dataplus._M_p);
          }
          WVar3 = this->warning_type_;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_230);
          std::ios_base::~ios_base(local_1c0);
          fVar12 = (float)local_268._0_4_;
          if (WVar3 == kExit) {
            return false;
          }
        }
      }
      if (this->is_ascii_output_ == true) {
        bVar5 = sptk::SnPrintf<float>(fVar12,local_258,0x80,local_b8);
        if (!bVar5) {
          return false;
        }
        sVar10 = strlen(local_b8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_b8,sVar10);
        if ((iVar11 + 1) % this->num_column_ == 0) {
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
          std::ostream::put(-0x78);
          std::ostream::flush();
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t",1);
        }
      }
      else {
        bVar5 = sptk::WriteStream<float>(fVar12,(ostream *)&std::cout);
        if (!bVar5) {
          return false;
        }
      }
    }
    uVar8 = (ulong)(iVar11 + 1);
  } while( true );
}

Assistant:

bool Run(std::istream* input_stream) const override {
    char buffer[kBufferSize];
    int index(0);
    for (;; ++index) {
      // Read.
      T1 input_data;
      if (is_ascii_input_) {
        std::string word;
        *input_stream >> word;
        if (word.empty()) break;
        try {
          input_data = static_cast<T1>(std::stold(word));
        } catch (std::invalid_argument&) {
          return false;
        }
      } else {
        if (!sptk::ReadStream(&input_data, input_stream)) {
          break;
        }
      }

      // Convert.
      T2 output_data(static_cast<T2>(input_data));

      bool is_clipped(false);
      {
        // Clipping.
        if (minimum_value_ < maximum_value_) {
          if (kSignedInteger == input_numeric_type_) {
            if (static_cast<std::int64_t>(input_data) <
                static_cast<std::int64_t>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<std::int64_t>(maximum_value_) <
                       static_cast<std::int64_t>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          } else if (kUnsignedInteger == input_numeric_type_) {
            if (static_cast<std::uint64_t>(input_data) <
                static_cast<std::uint64_t>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<std::uint64_t>(maximum_value_) <
                       static_cast<std::uint64_t>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          } else if (kFloatingPoint == input_numeric_type_) {
            if (static_cast<long double>(input_data) <
                static_cast<long double>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<long double>(maximum_value_) <
                       static_cast<long double>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          }
        }

        // Rounding.
        if (rounding_ && !is_clipped) {
          if (0.0 < input_data) {
            output_data = static_cast<T2>(input_data + 0.5);
          } else {
            output_data = static_cast<T2>(input_data - 0.5);
          }
        }
      }

      if (is_clipped && kIgnore != warning_type_) {
        std::ostringstream error_message;
        error_message << index << "th data is over the range of output type";
        sptk::PrintErrorMessage("x2x", error_message);
        if (kExit == warning_type_) return false;
      }

      // Write output.
      if (is_ascii_output_) {
        if (!sptk::SnPrintf(output_data, print_format_, sizeof(buffer),
                            buffer)) {
          return false;
        }
        std::cout << buffer;
        if (0 == (index + 1) % num_column_) {
          std::cout << std::endl;
        } else {
          std::cout << "\t";
        }
      } else {
        if (!sptk::WriteStream(output_data, &std::cout)) {
          return false;
        }
      }
    }

    if (is_ascii_output_ && 0 != index % num_column_) {
      std::cout << std::endl;
    }

    return true;
  }